

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_spec.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  string local_38;
  
  toLower(&local_38,&testCase->name);
  bVar1 = WildcardPattern::matches(&this->m_wildcardPattern,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                return m_wildcardPattern.matches( toLower( testCase.name ) );
            }